

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.hpp
# Opt level: O2

void pstore::serialize::serializer<std::__cxx11::string,void>::
     read<pstore::serialize::archive::database_reader&>(database_reader *archive,value_type *str)

{
  size_t count;
  span<char,__1L> span;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_standard_types_hpp:121:29)>
  deleter;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_standard_types_hpp:121:29)>
  local_20;
  
  (str->_M_dataplus)._M_p = (pointer)&str->field_2;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  local_20._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_standard_types_hpp:121:29)>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_standard_types_hpp:121:29)>
        )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_standard_types_hpp:121:29)>
          )str;
  count = string_helper::read_length<pstore::serialize::archive::database_reader&>(archive);
  std::__cxx11::string::resize((ulong)str);
  span = gsl::make_span<char>((str->_M_dataplus)._M_p,count);
  serialize::archive::database_reader::getn<pstore::gsl::span<char,_1l>,void>(archive,span);
  local_20._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_standard_types_hpp:121:29)>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_standard_types_hpp:121:29)>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_standard_types_hpp:121:29)>
          )0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/standard_types.hpp:121:29)>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_standard_types_hpp:121:29)>
                 *)&local_20);
  return;
}

Assistant:

static void read (Archive && archive, value_type & str) {
                // Read the body of the string.
                new (&str) value_type;

                // Deleter will ensure that the string is destroyed on exit if an exception is
                // raised here.
                auto dtor = [] (value_type * const p) {
                    using string = std::string;
                    p->~string ();
                };
                std::unique_ptr<value_type, decltype (dtor)> deleter (&str, dtor);

                auto const length = string_helper::read_length (archive);
                str.resize (length);

#ifdef PSTORE_HAVE_NON_CONST_STD_STRING_DATA
                char * const data = str.data ();
#else
                // TODO: this is technically undefined behaviour. Remove once we've got access to
                // the C++17 library on our platforms.
                auto * const data = const_cast<char *> (str.data ());
#endif
                // Now read the body of the string.
                serialize::read_uninit (
                    archive, gsl::make_span (data, static_cast<std::ptrdiff_t> (length)));

                // Release ownership from the deleter so that the initialized object is returned to
                // the caller.
                deleter.release ();
            }